

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O0

void test_bson_utf8_from_unichar(void)

{
  int iVar1;
  short local_12 [3];
  undefined4 uStack_c;
  char str [6];
  uint32_t len;
  
  bson_utf8_from_unichar(0,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x99,"test_bson_utf8_from_unichar","len == 1");
    abort();
  }
  bson_utf8_from_unichar(0x80,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x9b,"test_bson_utf8_from_unichar","len == 2");
    abort();
  }
  bson_utf8_from_unichar(0x800,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x9d,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  bson_utf8_from_unichar(0x10000,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0x9f,"test_bson_utf8_from_unichar","len == 4");
    abort();
  }
  bson_utf8_from_unichar(0x200000,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 5) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xa1,"test_bson_utf8_from_unichar","len == 5");
    abort();
  }
  bson_utf8_from_unichar(0x4000000,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 6) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xa3,"test_bson_utf8_from_unichar","len == 6");
    abort();
  }
  bson_utf8_from_unichar(0x7f,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xa9,"test_bson_utf8_from_unichar","len == 1");
    abort();
  }
  bson_utf8_from_unichar(0x7ff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xab,"test_bson_utf8_from_unichar","len == 2");
    abort();
  }
  bson_utf8_from_unichar(0xffff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xad,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  bson_utf8_from_unichar(0x1fffff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xaf,"test_bson_utf8_from_unichar","len == 4");
    abort();
  }
  bson_utf8_from_unichar(0x3ffffff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 5) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xb1,"test_bson_utf8_from_unichar","len == 5");
    abort();
  }
  bson_utf8_from_unichar(0x7fffffff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 6) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xb3,"test_bson_utf8_from_unichar","len == 6");
    abort();
  }
  bson_utf8_from_unichar(0xd7ff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xb9,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  bson_utf8_from_unichar(0xe000,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xbb,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  bson_utf8_from_unichar(0xfffd,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xbd,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  bson_utf8_from_unichar(0x10ffff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xbf,"test_bson_utf8_from_unichar","len == 4");
    abort();
  }
  bson_utf8_from_unichar(0x110000,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 4) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xc1,"test_bson_utf8_from_unichar","len == 4");
    abort();
  }
  bson_utf8_from_unichar(0x61,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xc4,"test_bson_utf8_from_unichar","len == 1");
    abort();
  }
  iVar1 = memcmp("a",local_12,1);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xc5,"test_bson_utf8_from_unichar","!memcmp (test1, str, 1)");
    abort();
  }
  bson_utf8_from_unichar(0xff,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            200,"test_bson_utf8_from_unichar","len == 2");
    abort();
  }
  if (local_12[0] != -0x403d) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xc9,"test_bson_utf8_from_unichar","!memcmp ((const char *) test2, str, 2)");
    abort();
  }
  bson_utf8_from_unichar(0x20ac,local_12,&stack0xfffffffffffffff4);
  if (uStack_c != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xcc,"test_bson_utf8_from_unichar","len == 3");
    abort();
  }
  iVar1 = memcmp(test_bson_utf8_from_unichar::test3,local_12,3);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
            0xcd,"test_bson_utf8_from_unichar","!memcmp ((const char *) test3, str, 3)");
    abort();
  }
  return;
}

Assistant:

static void
test_bson_utf8_from_unichar (void)
{
   static const char test1[] = {'a'};
   static const unsigned char test2[] = {0xc3, 0xbf};
   static const unsigned char test3[] = {0xe2, 0x82, 0xac};
   uint32_t len;
   char str[6];

   /*
    * First possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x00000080, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x00000800, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x00010000, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00200000, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x04000000, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Last possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0x0000007F, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x000007FF, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x0000FFFF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x001FFFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x03FFFFFF, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x7FFFFFFF, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Other interesting values.
    */
   bson_utf8_from_unichar (0x0000D7FF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000E000, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000FFFD, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0010FFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00110000, str, &len);
   BSON_ASSERT (len == 4);

   bson_utf8_from_unichar ('a', str, &len);
   BSON_ASSERT (len == 1);
   BSON_ASSERT (!memcmp (test1, str, 1));

   bson_utf8_from_unichar (0xFF, str, &len);
   BSON_ASSERT (len == 2);
   BSON_ASSERT (!memcmp ((const char *) test2, str, 2));

   bson_utf8_from_unichar (0x20AC, str, &len);
   BSON_ASSERT (len == 3);
   BSON_ASSERT (!memcmp ((const char *) test3, str, 3));
}